

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Federate.cpp
# Opt level: O1

iteration_time __thiscall helics::Federate::requestTimeIterativeComplete(Federate *this)

{
  shared_guarded<helics::AsyncFedCallInfo,_std::mutex> *psVar1;
  undefined1 auVar2 [12];
  InvalidFunctionCall *this_00;
  bool bVar3;
  string_view message;
  iteration_time iVar4;
  handle asyncInfo;
  unique_lock<std::mutex> local_30;
  
  LOCK();
  bVar3 = (this->currentMode)._M_i == PENDING_ITERATIVE_TIME;
  if (bVar3) {
    (this->currentMode)._M_i = EXECUTING;
  }
  UNLOCK();
  if (!bVar3) {
    this_00 = (InvalidFunctionCall *)__cxa_allocate_exception(0x28);
    message._M_str =
         "cannot call requestTimeIterativeComplete without first calling requestTimeIterativeAsync function"
    ;
    message._M_len = 0x61;
    InvalidFunctionCall::InvalidFunctionCall(this_00,message);
    __cxa_throw(this_00,&InvalidFunctionCall::typeinfo,HelicsException::~HelicsException);
  }
  psVar1 = (this->asyncCallInfo)._M_t.
           super___uniq_ptr_impl<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>,_std::default_delete<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_*,_std::default_delete<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_>_>
           .
           super__Head_base<0UL,_gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_*,_false>
           ._M_head_impl;
  local_30._M_device = &psVar1->m_mutex;
  local_30._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_30);
  local_30._M_owns = true;
  iVar4 = std::future<helics::iteration_time>::get(&(psVar1->m_obj).timeRequestIterativeFuture);
  switch(iVar4._8_4_ & 0xff) {
  case 0:
    bVar3 = false;
    goto LAB_001db959;
  case 2:
    bVar3 = true;
LAB_001db959:
    postTimeRequestOperations(this,iVar4.grantedTime.internalTimeCode,bVar3);
    break;
  case 3:
    updateFederateMode(this,FINISHED);
    updateSimulationTime
              (this,iVar4.grantedTime.internalTimeCode,(Time)(this->mCurrentTime).internalTimeCode,
               false);
    break;
  case 7:
    updateFederateMode(this,ERROR_STATE);
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_30);
  auVar2 = iVar4._0_12_;
  iVar4._12_4_ = 0;
  iVar4.grantedTime.internalTimeCode = auVar2._0_8_;
  iVar4.state = auVar2[8];
  iVar4._9_3_ = auVar2._9_3_;
  return iVar4;
}

Assistant:

iteration_time Federate::requestTimeIterativeComplete()
{
    auto exp = Modes::PENDING_ITERATIVE_TIME;
    if (currentMode.compare_exchange_strong(exp, Modes::EXECUTING)) {
        auto asyncInfo = asyncCallInfo->lock();
        auto iterativeTime = asyncInfo->timeRequestIterativeFuture.get();
        switch (iterativeTime.state) {
            case IterationResult::NEXT_STEP:
                postTimeRequestOperations(iterativeTime.grantedTime, false);
                break;
            case IterationResult::ITERATING:
                postTimeRequestOperations(iterativeTime.grantedTime, true);
                break;
            case IterationResult::HALTED:
                updateFederateMode(Modes::FINISHED);
                updateSimulationTime(iterativeTime.grantedTime, mCurrentTime, false);
                break;
            case IterationResult::ERROR_RESULT:
                // LCOV_EXCL_START
                updateFederateMode(Modes::ERROR_STATE);
                break;
                // LCOV_EXCL_STOP
        }
        return iterativeTime;
    }
    throw(InvalidFunctionCall(
        "cannot call requestTimeIterativeComplete without first calling requestTimeIterativeAsync function"));
}